

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.hpp
# Opt level: O3

Option<const_Lib::Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>_&>
 __thiscall
Lib::
Map<const_Kernel::MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_>_*,_Lib::Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::DerefPtrHash<Lib::StlHash>_>
::tryGet(Map<const_Kernel::MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_>_*,_Lib::Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::DerefPtrHash<Lib::StlHash>_>
         *this,MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_> **key)

{
  ulong uVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_> *pMVar5;
  undefined8 *in_RDX;
  MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_> *pMVar6;
  MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_> **ppMVar7;
  
  uVar3 = StackHash<Lib::StlHash>::
          hash<Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>>>
                    ((Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
                      *)*in_RDX,0x811c9dc5);
  uVar3 = uVar3 + (uVar3 == 0);
  pMVar5 = key[1];
  ppMVar7 = (MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_> **)0x0;
  uVar1 = (ulong)uVar3 % (ulong)*(uint *)key;
  uVar4 = (uint)pMVar5[uVar1]._factors._capacity;
  if (uVar4 != 0) {
    pMVar6 = pMVar5 + uVar1;
    ppMVar7 = (MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_> **)0x0;
    do {
      if (uVar4 == uVar3) {
        bVar2 = Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::
                operator==((Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
                            *)(pMVar6->_factors)._stack,
                           (Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
                            *)*in_RDX);
        if (bVar2) {
          ppMVar7 = &(pMVar6->_factors)._cursor;
          break;
        }
        pMVar5 = key[1];
      }
      pMVar6 = pMVar6 + 1;
      if (pMVar6 == key[2]) {
        pMVar6 = pMVar5;
      }
      uVar4 = (uint)(pMVar6->_factors)._capacity;
    } while (uVar4 != 0);
  }
  *(MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_> ***)this = ppMVar7;
  return (OptionBase<const_Lib::Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>_&>
          )(OptionBase<const_Lib::Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>_&>
            )this;
}

Assistant:

Option<Val const&> tryGet(Key const& key) const
  {
    using Opt = Option<Val const&>;

    auto code = hashCode(key);
    Entry* entry;
    for (entry = firstEntryForCode(code); entry->occupied(); entry = nextEntry(entry)) {
      if (entry->code == code && Hash::equals(entry->key(),key)) {
        return Opt(entry->value());
      }
    }

    return Opt();
  }